

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEBody.cpp
# Opt level: O0

CEBody * __thiscall CEBody::operator=(CEBody *this,CEBody *other)

{
  CEBody *in_RSI;
  CEBody *in_RDI;
  
  if (in_RDI != in_RSI) {
    CESkyCoord::operator=(&in_RSI->super_CESkyCoord,&in_RDI->super_CESkyCoord);
    free_members(in_RDI);
    init_members((CEBody *)0x149ade);
    copy_members(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

CEBody& CEBody::operator=(const CEBody& other)
{
    if (this != &other) {
        // Copy parent class parameters
        this->CESkyCoord::operator=(other);

        // Reset this object and copy values from 'other'
        free_members();
        init_members();
        copy_members(other);
    }
    return *this;
}